

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FmaCaseInstance::compare
          (FmaCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  pointer pSVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  bool bVar10;
  uint uVar11;
  deRoundingMode dVar12;
  ostream *os;
  ostringstream *this_00;
  FloatFormat *this_01;
  ulong uVar13;
  bool bVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  Interval ib;
  Interval ia;
  Interval local_220;
  double local_208;
  undefined8 uStack_200;
  Interval ic;
  Interval ref;
  double local_178;
  double local_168;
  double local_158;
  double local_148;
  Interval local_138;
  Interval local_120;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  Interval local_c0;
  FloatFormat local_a8 [3];
  
  pSVar6 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = *(int *)((long)&(pSVar6->varType).m_data + 4);
  uVar11 = glu::getDataTypeScalarSize((pSVar6->varType).m_data.basic.type);
  if (0 < (int)uVar11) {
    this_01 = local_a8 + iVar5;
    uVar13 = 0;
    bVar14 = false;
    do {
      fVar1 = *(float *)((long)*inputs + uVar13 * 4);
      fVar2 = *(float *)((long)inputs[1] + uVar13 * 4);
      fVar3 = *(float *)((long)inputs[2] + uVar13 * 4);
      fVar4 = *(float *)((long)*outputs + uVar13 * 4);
      tcu::FloatFormat::FloatFormat(local_a8,0,0,7,false,YES,MAYBE,MAYBE);
      tcu::FloatFormat::FloatFormat(local_a8 + 1,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
      tcu::FloatFormat::FloatFormat(local_a8 + 2,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
      dVar16 = (double)fVar1;
      ib.m_hasNaN = NAN(fVar1);
      ib.m_lo = INFINITY;
      if (!ib.m_hasNaN) {
        ib.m_lo = dVar16;
      }
      ib.m_hi = -INFINITY;
      if (!ib.m_hasNaN) {
        ib.m_hi = dVar16;
      }
      tcu::FloatFormat::convert(&ia,this_01,&ib);
      ic.m_hasNaN = NAN(fVar2);
      ic.m_lo = INFINITY;
      ic.m_hi = -INFINITY;
      if (!ic.m_hasNaN) {
        ic.m_lo = (double)fVar2;
        ic.m_hi = ic.m_lo;
      }
      tcu::FloatFormat::convert(&ib,this_01,&ic);
      local_220.m_hasNaN = NAN(fVar3);
      local_220.m_lo = INFINITY;
      local_220.m_hi = -INFINITY;
      if (!local_220.m_hasNaN) {
        local_220.m_lo = (double)fVar3;
        local_220.m_hi = local_220.m_lo;
      }
      tcu::FloatFormat::convert(&ic,this_01,&local_220);
      local_220.m_hasNaN = false;
      local_220.m_lo = INFINITY;
      local_220.m_hi = -INFINITY;
      dVar12 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar20 = ia.m_lo;
      dVar16 = ib.m_lo;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar20 = dVar20 * dVar16;
      bVar10 = NAN(dVar20);
      local_d8 = -INFINITY;
      if (!bVar10) {
        local_d8 = dVar20;
      }
      uStack_d0 = 0;
      local_e8 = INFINITY;
      if (!bVar10) {
        local_e8 = dVar20;
      }
      uStack_e0 = 0;
      dVar16 = ia.m_lo * ib.m_lo;
      local_158 = INFINITY;
      local_148 = -INFINITY;
      if (!NAN(dVar16)) {
        local_158 = dVar16;
        local_148 = dVar16;
      }
      deSetRoundingMode(dVar12);
      dVar12 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar17 = ia.m_lo;
      dVar20 = ib.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar17 = dVar17 * dVar20;
      local_f8 = -INFINITY;
      if (!NAN(dVar17)) {
        local_f8 = dVar17;
      }
      uStack_f0 = 0;
      dVar20 = ia.m_lo * ib.m_hi;
      local_168 = INFINITY;
      if (!NAN(dVar20)) {
        local_168 = dVar20;
      }
      deSetRoundingMode(dVar12);
      dVar12 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar18 = ia.m_hi;
      local_208 = ib.m_lo;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar18 = dVar18 * local_208;
      local_108 = -INFINITY;
      if (!NAN(dVar18)) {
        local_108 = dVar18;
      }
      uStack_100 = 0;
      local_208 = ia.m_hi * ib.m_lo;
      uStack_200 = 0;
      local_178 = INFINITY;
      if (!NAN(local_208)) {
        local_178 = local_208;
      }
      deSetRoundingMode(dVar12);
      dVar12 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar21 = ia.m_hi;
      dVar19 = ib.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar29 = ia.m_hi;
      dVar27 = ib.m_hi;
      deSetRoundingMode(dVar12);
      dVar21 = dVar21 * dVar19;
      bVar7 = NAN(dVar21);
      dVar19 = -INFINITY;
      if (!bVar7) {
        dVar19 = dVar21;
      }
      dVar24 = INFINITY;
      if (!bVar7) {
        dVar24 = dVar21;
      }
      dVar29 = dVar29 * dVar27;
      bVar8 = NAN(dVar29);
      dVar27 = -INFINITY;
      if (!bVar8) {
        dVar27 = dVar29;
      }
      dVar22 = (double)(~-(ulong)(local_e8 <= local_158) & (ulong)local_158 |
                       (ulong)local_e8 & -(ulong)(local_e8 <= local_158));
      dVar23 = (double)(~-(ulong)(local_148 <= local_d8) & (ulong)local_148 |
                       (ulong)local_d8 & -(ulong)(local_148 <= local_d8));
      dVar21 = (double)(-(ulong)NAN(dVar17) & 0x7ff0000000000000 |
                       ~-(ulong)NAN(dVar17) & (ulong)dVar17);
      dVar28 = (double)(~-(ulong)NAN(dVar20) & (ulong)dVar20 |
                       -(ulong)NAN(dVar20) & 0xfff0000000000000);
      uVar15 = -(ulong)(dVar21 <= local_168);
      dVar26 = (double)(~uVar15 & (ulong)local_168 | uVar15 & (ulong)dVar21);
      uVar15 = -(ulong)(dVar28 <= local_f8);
      dVar9 = (double)(~uVar15 & (ulong)dVar28 | (ulong)local_f8 & uVar15);
      dVar28 = (double)(-(ulong)NAN(dVar18) & 0x7ff0000000000000 |
                       ~-(ulong)NAN(dVar18) & (ulong)dVar18);
      dVar21 = (double)(~-(ulong)NAN(local_208) & (ulong)local_208 |
                       -(ulong)NAN(local_208) & 0xfff0000000000000);
      uVar15 = -(ulong)(dVar28 <= local_178);
      dVar28 = (double)(~uVar15 & (ulong)local_178 | uVar15 & (ulong)dVar28);
      uVar15 = -(ulong)(dVar21 <= local_108);
      dVar21 = (double)(~uVar15 & (ulong)dVar21 | (ulong)local_108 & uVar15);
      dVar27 = (double)(~-(ulong)(dVar27 <= dVar19) & (ulong)dVar27 |
                       (ulong)dVar19 & -(ulong)(dVar27 <= dVar19));
      dVar19 = INFINITY;
      if (!bVar8) {
        dVar19 = dVar29;
      }
      dVar25 = (double)(~-(ulong)(dVar24 <= dVar19) & (ulong)dVar19 |
                       (ulong)dVar24 & -(ulong)(dVar24 <= dVar19));
      uVar15 = -(ulong)(dVar22 <= dVar26);
      dVar19 = (double)(~uVar15 & (ulong)dVar26 | uVar15 & (ulong)dVar22);
      uVar15 = -(ulong)(dVar9 <= dVar23);
      dVar29 = (double)(~uVar15 & (ulong)dVar9 | uVar15 & (ulong)dVar23);
      uVar15 = -(ulong)(dVar19 <= dVar28);
      dVar24 = (double)(~uVar15 & (ulong)dVar28 | uVar15 & (ulong)dVar19);
      uVar15 = -(ulong)(dVar21 <= dVar29);
      dVar19 = (double)(~uVar15 & (ulong)dVar21 | uVar15 & (ulong)dVar29);
      local_138.m_hasNaN =
           (bVar7 || bVar8) ||
           (((NAN(dVar20) || NAN(dVar18)) || NAN(local_208)) ||
           ((bVar10 || NAN(dVar16)) || NAN(dVar17)));
      uVar15 = -(ulong)(dVar24 <= dVar25);
      local_138.m_lo = (double)(uVar15 & (ulong)dVar24 | ~uVar15 & (ulong)dVar25);
      uVar15 = -(ulong)(dVar27 <= dVar19);
      local_138.m_hi = (double)(uVar15 & (ulong)dVar19 | ~uVar15 & (ulong)dVar27);
      bVar10 = false;
      if ((ia.m_lo != -INFINITY) && (ia.m_hi != INFINITY)) {
        bVar10 = ib.m_hi != INFINITY && ib.m_lo != -INFINITY;
      }
      tcu::FloatFormat::roundOut(&local_c0,this_01,&local_138,bVar10);
      tcu::FloatFormat::convert(&local_120,this_01,&local_c0);
      dVar17 = local_120.m_hi;
      dVar20 = local_120.m_lo;
      dVar12 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar16 = ic.m_lo;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar16 = dVar16 + dVar20;
      local_220.m_hasNaN = NAN(dVar16);
      dVar18 = -INFINITY;
      if (!local_220.m_hasNaN) {
        dVar18 = dVar16;
      }
      dVar19 = INFINITY;
      if (!local_220.m_hasNaN) {
        dVar19 = dVar16;
      }
      dVar21 = ic.m_hi + dVar17;
      dVar16 = -INFINITY;
      dVar27 = INFINITY;
      if (!NAN(dVar21)) {
        dVar16 = dVar21;
        dVar27 = dVar21;
      }
      local_220.m_hasNaN = local_220.m_hasNaN || NAN(dVar21);
      local_220.m_lo =
           (double)(~-(ulong)(dVar19 <= dVar27) & (ulong)dVar27 |
                   (ulong)dVar19 & -(ulong)(dVar19 <= dVar27));
      local_220.m_hi =
           (double)(~-(ulong)(dVar16 <= dVar18) & (ulong)dVar16 |
                   (ulong)dVar18 & -(ulong)(dVar16 <= dVar18));
      deSetRoundingMode(dVar12);
      bVar10 = false;
      if ((dVar20 != -INFINITY) && (dVar17 != INFINITY)) {
        bVar10 = ic.m_hi != INFINITY && ic.m_lo != -INFINITY;
      }
      tcu::FloatFormat::roundOut(&local_120,this_01,&local_220,bVar10);
      tcu::FloatFormat::convert(&ref,this_01,&local_120);
      dVar16 = INFINITY;
      if (!NAN(fVar4)) {
        dVar16 = (double)fVar4;
      }
      dVar20 = -INFINITY;
      if (!NAN(fVar4)) {
        dVar20 = (double)fVar4;
      }
      if (((dVar16 < ref.m_lo) || (ref.m_hi < dVar20)) || ((NAN(fVar4) && (ref.m_hasNaN == false))))
      {
        this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        os = (ostream *)std::ostream::operator<<(this_00,(int)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(os,"] = ",4);
        tcu::operator<<(os,&ref);
        return bVar14;
      }
      uVar13 = uVar13 + 1;
      bVar14 = uVar11 <= uVar13;
    } while (uVar13 != uVar11);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}